

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

string_view __thiscall Jupiter::Socket::getData(Socket *this)

{
  int iVar1;
  string_view sVar2;
  Socket *this_local;
  
  iVar1 = (*this->_vptr_Socket[8])();
  if (iVar1 < 1) {
    Buffer::clear(&this->m_data->buffer);
  }
  sVar2 = Buffer::view(&this->m_data->buffer);
  return sVar2;
}

Assistant:

std::string_view Jupiter::Socket::getData() {
	if (this->recv() <= 0) {
		m_data->buffer.clear();
	}
	return m_data->buffer.view();
}